

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O1

void __thiscall SGParser::Generator::NFA::Or(NFA *this,NFA *b)

{
  pointer *pppNVar1;
  NFANode *pNVar2;
  pointer ppNVar3;
  iterator __position;
  NFANode *modify;
  NFA *this_00;
  pointer ppNVar4;
  NFANode *local_38;
  NFANode *pfinalState;
  
  if ((this != b) &&
     (pNVar2 = this->pStartState, b->pStartState != (NFANode *)0x0 || pNVar2 != (NFANode *)0x0)) {
    modify = (NFANode *)operator_new(0x38);
    *(undefined8 *)&modify->AcceptingState = 0;
    *(undefined8 *)
     ((long)&(modify->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&(modify->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(modify->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)
     ((long)&(modify->LinkPtr).
             super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&(modify->LinkPtr).
             super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined4 *)
     ((long)&(modify->LinkPtr).
             super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    this_00 = (NFA *)0x38;
    local_38 = (NFANode *)operator_new(0x38);
    *(undefined8 *)&local_38->AcceptingState = 0;
    *(undefined8 *)
     ((long)&(local_38->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&(local_38->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined8 *)
     ((long)&(local_38->LinkChar).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    *(undefined8 *)
     ((long)&(local_38->LinkPtr).
             super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
    *(undefined8 *)
     ((long)&(local_38->LinkPtr).
             super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
    *(undefined4 *)
     ((long)&(local_38->LinkPtr).
             super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
    if (pNVar2 != (NFANode *)0x0) {
      AddLink(this_00,modify,0,pNVar2);
      ppNVar3 = (this->FinalState).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppNVar4 = (this->FinalState).
                     super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppNVar4 != ppNVar3;
          ppNVar4 = ppNVar4 + 1) {
        pNVar2 = *ppNVar4;
        AddLink(this_00,pNVar2,0,local_38);
        pNVar2->AcceptingState = 0;
      }
      ppNVar4 = (this->FinalState).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->FinalState).
          super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppNVar4) {
        (this->FinalState).
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppNVar4;
      }
    }
    if (b->pStartState != (NFANode *)0x0) {
      AddLink(this_00,modify,0,b->pStartState);
      ppNVar3 = (b->FinalState).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppNVar4 = (b->FinalState).
                     super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppNVar4 != ppNVar3;
          ppNVar4 = ppNVar4 + 1) {
        pNVar2 = *ppNVar4;
        AddLink(this_00,pNVar2,0,local_38);
        pNVar2->AcceptingState = 0;
      }
      ppNVar4 = (b->FinalState).
                super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((b->FinalState).
          super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppNVar4) {
        (b->FinalState).
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppNVar4;
      }
    }
    this->pStartState = modify;
    local_38->AcceptingState = this->LexemeId;
    __position._M_current =
         (this->FinalState).
         super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->FinalState).
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>::
      _M_realloc_insert<SGParser::Generator::NFANode*const&>
                ((vector<SGParser::Generator::NFANode*,std::allocator<SGParser::Generator::NFANode*>>
                  *)&this->FinalState,__position,&local_38);
    }
    else {
      *__position._M_current = local_38;
      pppNVar1 = &(this->FinalState).
                  super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
    b->pStartState = (NFANode *)0x0;
  }
  return;
}

Assistant:

void NFA::Or(NFA& b) {
    // Same as us
    if (this == &b)
        return;
    if (!pStartState && !b.pStartState)
        return;

    const auto pnewStartState = NewState(0u);
    const auto pfinalState    = NewState(0u);

    // Connect the start state to the start states of this and b
    // with epsilon transitions
    if (pStartState) {
        AddLink(pnewStartState, NFANode::Epsilon, pStartState);

        // Connect all the final states of a and b to the new final state
        // Make the final states of a and b no longer final states
        for (const auto fs : FinalState) {
            AddLink(fs, NFANode::Epsilon, pfinalState);
            fs->AcceptingState = 0u;
        }
        FinalState.clear();
    }
    if (b.pStartState) {
        AddLink(pnewStartState, NFANode::Epsilon, b.pStartState);

        for (const auto fs : b.FinalState) {
            AddLink(fs, NFANode::Epsilon, pfinalState);
            fs->AcceptingState = 0u;
        }
        b.FinalState.clear();
    }

    // Set new start state
    pStartState = pnewStartState;
    // Make the state final
    pfinalState->AcceptingState = LexemeId;
    FinalState.push_back(pfinalState);

    // Release b's data
    b.pStartState = nullptr;
}